

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# General.cc
# Opt level: O0

void __thiscall
General_returnValuesWithSignals_Test::~General_returnValuesWithSignals_Test
          (General_returnValuesWithSignals_Test *this)

{
  void *in_RDI;
  
  ~General_returnValuesWithSignals_Test((General_returnValuesWithSignals_Test *)0x139358);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(General, returnValuesWithSignals)
{
  sigs::Signal<int()> s, s2, s3;
  s3.connect([] { return 1; });
  s2.connect([] { return 2; });
  s2.connect([] { return 3; });
  s.connect(s2);
  s.connect(s3);
  s.connect([] { return 4; });

  int sum = 0;
  s([&sum](int retVal) { sum += retVal; });

  EXPECT_EQ(sum, 1 + 2 + 3 + 4);
}